

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O0

size_t sysbvm_tuple_hash(sysbvm_context_t *context,sysbvm_tuple_t tuple)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t hashFunction;
  sysbvm_tuple_t type;
  sysbvm_tuple_t tuple_local;
  sysbvm_context_t *context_local;
  
  sVar1 = sysbvm_tuple_getType(context,tuple);
  if ((sVar1 == 0) || (sVar1 = sysbvm_type_getHashFunction(context,sVar1), sVar1 == 0)) {
    context_local = (sysbvm_context_t *)sysbvm_tuple_identityHash(tuple);
  }
  else {
    sVar1 = sysbvm_function_apply1(context,sVar1,tuple);
    context_local = (sysbvm_context_t *)sysbvm_tuple_size_decode(sVar1);
  }
  return (size_t)context_local;
}

Assistant:

SYSBVM_API size_t sysbvm_tuple_hash(sysbvm_context_t *context, sysbvm_tuple_t tuple)
{
    sysbvm_tuple_t type = sysbvm_tuple_getType(context, tuple);
    if(type)
    {
        sysbvm_tuple_t hashFunction = sysbvm_type_getHashFunction(context, type);
        if(hashFunction)
            return sysbvm_tuple_size_decode(sysbvm_function_apply1(context, hashFunction, tuple));
    }

    return sysbvm_tuple_identityHash(tuple);
}